

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

int enet_socket_connect(ENetSocket socket,ENetAddress *address)

{
  int iVar1;
  int *piVar2;
  sockaddr local_24;
  undefined8 uStack_14;
  uint local_c;
  
  local_24.sa_data[2] = '\0';
  local_24.sa_data[3] = '\0';
  local_24.sa_data[4] = '\0';
  local_24.sa_data[5] = '\0';
  local_24.sa_family = 10;
  local_24.sa_data._0_2_ = address->port << 8 | address->port >> 8;
  local_24.sa_data._6_8_ = *(undefined8 *)&(address->host).__in6_u;
  uStack_14 = *(undefined8 *)((long)&(address->host).__in6_u + 8);
  local_c = (uint)address->sin6_scope_id;
  iVar1 = connect(socket,&local_24,0x1c);
  if ((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 == 0x73)) {
    return 0;
  }
  return iVar1;
}

Assistant:

int enet_socket_connect(ENetSocket socket, const ENetAddress *address) {
        struct sockaddr_in6 sin;
        int result;

        memset(&sin, 0, sizeof(struct sockaddr_in6));

        sin.sin6_family     = AF_INET6;
        sin.sin6_port       = ENET_HOST_TO_NET_16(address->port);
        sin.sin6_addr       = address->host;
        sin.sin6_scope_id   = address->sin6_scope_id;

        result = connect(socket, (struct sockaddr *)&sin, sizeof(struct sockaddr_in6));
        if (result == -1 && errno == EINPROGRESS) {
            return 0;
        }

        return result;
    }